

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
BuildTestValidationWithCircularDependency::~BuildTestValidationWithCircularDependency
          (BuildTestValidationWithCircularDependency *this)

{
  BuildTest::~BuildTest(&this->super_BuildTest);
  operator_delete(this,0x460);
  return;
}

Assistant:

TEST_F(BuildTest, ValidationWithCircularDependency) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "build out: cat in |@ validate\n"
    "build validate: cat validate_in | out\n"
    "build validate_in: cat validate\n"));

  fs_.Create("in", "");

  string err;
  EXPECT_FALSE(builder_.AddTarget("out", &err));
  EXPECT_EQ("dependency cycle: validate -> validate_in -> validate", err);
}